

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::TokenManager::ValidateSignature
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,
          Message *aSignedMessage)

{
  string *this_00;
  ErrorCode EVar1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Sign1Message sign1Msg;
  ByteArray rawPublicKeyInToken;
  ByteArray externalData;
  CborMap publicKeyInToken;
  Sign1Message SStack_118;
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  parse_func local_e0 [1];
  ByteArray local_d8;
  ByteArray local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  CborValue local_90;
  string local_78;
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_98 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_98;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cose::Sign1Message::Sign1Message(&SStack_118);
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CborValue::CborValue(&local_90);
  local_90._vptr_CborValue = (_func_int **)&PTR__CborValue_002b9e88;
  if ((aSignature->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aSignature->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_108._0_4_ = none_type;
    local_100._M_p = "the signature is empty";
    local_f8 = 0x16;
    local_f0._M_allocated_capacity = 0;
    local_e0[0] = (parse_func)0x0;
    begin = "the signature is empty";
    local_f0._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_108;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_108);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"the signature is empty",(string_view)ZEXT816(0x16),args);
    local_58 = kInvalidArgs;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    __return_storage_ptr__->mCode = local_58;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_001f1549;
  }
  else {
    cose::Sign1Message::Deserialize((Error *)local_108,&SStack_118,aSignature);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    PrepareSigningContent((Error *)local_108,&local_b8,aSignedMessage);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    cose::Sign1Message::SetExternalData((Error *)local_108,&SStack_118,&local_b8);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    cose::Sign1Message::Validate
              ((Error *)local_108,&SStack_118,(mbedtls_pk_context *)&this->mPublicKey);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    GetPublicKeyInToken((Error *)local_108,this,&local_d8);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    CborValue::Deserialize
              ((Error *)local_108,&local_90,
               local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p);
    }
    if (EVar1 != kNone) goto LAB_001f1549;
    cose::Sign1Message::Validate((Error *)local_108,&SStack_118,(CborMap *)&local_90);
    __return_storage_ptr__->mCode = local_108._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_100);
    local_78._M_dataplus._M_p = local_100._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p == &local_f0) goto LAB_001f1549;
  }
  operator_delete(local_78._M_dataplus._M_p);
LAB_001f1549:
  cose::Sign1Message::Free(&SStack_118);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateSignature(const ByteArray &aSignature, const coap::Message &aSignedMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          rawPublicKeyInToken;
    CborMap            publicKeyInToken;

    VerifyOrExit(!aSignature.empty(), error = ERROR_INVALID_ARGS("the signature is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(sign1Msg, aSignature));

    SuccessOrExit(error = PrepareSigningContent(externalData, aSignedMessage));
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));
    SuccessOrExit(error = sign1Msg.Validate(mPublicKey));
    SuccessOrExit(error = GetPublicKeyInToken(rawPublicKeyInToken));
    SuccessOrExit(error =
                      CborValue::Deserialize(publicKeyInToken, rawPublicKeyInToken.data(), rawPublicKeyInToken.size()));
    SuccessOrExit(error = sign1Msg.Validate(publicKeyInToken));

exit:
    sign1Msg.Free();
    return error;
}